

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmdPlugin.c
# Opt level: O1

int Abc_ManReadInteger(char *pFileName,char *pToken)

{
  char *__haystack;
  int iVar1;
  Vec_Str_t *__ptr;
  char *pcVar2;
  size_t sVar3;
  
  __ptr = Abc_ManReadFile(pFileName);
  if (__ptr == (Vec_Str_t *)0x0) {
    iVar1 = -1;
  }
  else {
    __haystack = __ptr->pArray;
    pcVar2 = strstr(__haystack,pToken);
    if (pcVar2 == (char *)0x0) {
      iVar1 = -1;
    }
    else {
      sVar3 = strlen(pToken);
      iVar1 = atoi(pcVar2 + sVar3);
    }
    if (__haystack != (char *)0x0) {
      free(__haystack);
      __ptr->pArray = (char *)0x0;
    }
    free(__ptr);
  }
  return iVar1;
}

Assistant:

int Abc_ManReadInteger( char * pFileName, char * pToken )
{
    int Result = -1;
    Vec_Str_t * vStr;
    char * pStr;
    vStr = Abc_ManReadFile( pFileName );
    if ( vStr == NULL )
        return -1;
    pStr = Vec_StrArray( vStr );
    pStr = strstr( pStr, pToken );
    if ( pStr != NULL )
        Result = atoi( pStr + strlen(pToken) );
    Vec_StrFree( vStr );
    return Result;
}